

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::Sequence::Dump(Sequence *this,FILE *stream)

{
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  StructuralComponent::Dump(&this->super_StructuralComponent,stream);
  fprintf((FILE *)stream,"  %22s:\n","StructuralComponents");
  FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::Dump
            (&(this->StructuralComponents).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>,
             stream,0);
  return;
}

Assistant:

void
Sequence::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  StructuralComponent::Dump(stream);
  fprintf(stream, "  %22s:\n",  "StructuralComponents");
  StructuralComponents.Dump(stream);
}